

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printSummaryRow
          (ConsoleReporter *this,string *label,
          vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *cols,size_t row)

{
  bool bVar1;
  reference pvVar2;
  ulong uVar3;
  ostream *poVar4;
  size_type in_RCX;
  string *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *__range1;
  string value;
  SummaryColumn col;
  undefined4 in_stack_fffffffffffffef8;
  Code in_stack_fffffffffffffefc;
  SummaryColumn *in_stack_ffffffffffffff00;
  SummaryColumn *in_stack_ffffffffffffff08;
  SummaryColumn *in_stack_ffffffffffffff10;
  Colour local_af;
  Colour local_ae;
  Colour local_ad [13];
  SummaryColumn *local_a0;
  __normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
  local_98 [2];
  size_type local_88;
  string *local_78;
  string local_68 [32];
  string local_48 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = in_RCX;
  local_78 = in_RSI;
  local_98[0]._M_current =
       (SummaryColumn *)
       clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::begin
                 ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_a0 = (SummaryColumn *)
             clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::end
                       ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)
                        CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
                             *)in_stack_ffffffffffffff00,
                            (__normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
                             *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
    ::operator*(local_98);
    SummaryColumn::SummaryColumn(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    pvVar2 = clara::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_20,local_88);
    std::__cxx11::string::string(local_68,(string *)pvVar2);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      bVar1 = std::operator!=(&in_stack_ffffffffffffff00->label,
                              (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
      ;
      if (bVar1) {
        poVar4 = *(ostream **)(in_RDI + 0x18);
        Colour::Colour((Colour *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        poVar4 = Catch::operator<<(poVar4,&local_ae);
        std::operator<<(poVar4," | ");
        Colour::~Colour((Colour *)0x250563);
        poVar4 = *(ostream **)(in_RDI + 0x18);
        Colour::Colour((Colour *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        poVar4 = Catch::operator<<(poVar4,&local_af);
        in_stack_ffffffffffffff10 = (SummaryColumn *)std::operator<<(poVar4,local_68);
        in_stack_ffffffffffffff08 =
             (SummaryColumn *)std::operator<<((ostream *)in_stack_ffffffffffffff10,' ');
        std::operator<<((ostream *)in_stack_ffffffffffffff08,local_48);
        Colour::~Colour((Colour *)0x2505de);
      }
    }
    else {
      poVar4 = std::operator<<(*(ostream **)(in_RDI + 0x18),local_78);
      std::operator<<(poVar4,": ");
      bVar1 = std::operator!=(&in_stack_ffffffffffffff00->label,
                              (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
      ;
      if (bVar1) {
        std::operator<<(*(ostream **)(in_RDI + 0x18),local_68);
      }
      else {
        poVar4 = *(ostream **)(in_RDI + 0x18);
        Colour::Colour((Colour *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        poVar4 = Catch::operator<<(poVar4,local_ad);
        std::operator<<(poVar4,"- none -");
        Colour::~Colour((Colour *)0x2504cf);
      }
    }
    std::__cxx11::string::~string(local_68);
    SummaryColumn::~SummaryColumn(in_stack_ffffffffffffff00);
    __gnu_cxx::
    __normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
    ::operator++(local_98);
  }
  std::operator<<(*(ostream **)(in_RDI + 0x18),'\n');
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ConsoleReporter::printSummaryRow(std::string const& label, std::vector<SummaryColumn> const& cols, std::size_t row) {
    for (auto col : cols) {
        std::string value = col.rows[row];
        if (col.label.empty()) {
            stream << label << ": ";
            if (value != "0")
                stream << value;
            else
                stream << Colour(Colour::Warning) << "- none -";
        } else if (value != "0") {
            stream << Colour(Colour::LightGrey) << " | ";
            stream << Colour(col.colour)
                << value << ' ' << col.label;
        }
    }
    stream << '\n';
}